

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.c
# Opt level: O0

void mbedtls_sha512_update(mbedtls_sha512_context *ctx,uchar *input,size_t ilen)

{
  ulong uVar1;
  ulong __n;
  uint local_2c;
  uint left;
  size_t fill;
  size_t ilen_local;
  uchar *input_local;
  mbedtls_sha512_context *ctx_local;
  
  if (ilen != 0) {
    uVar1 = ctx->total[0];
    local_2c = (uint)uVar1 & 0x7f;
    __n = (ulong)(0x80 - local_2c);
    ctx->total[0] = ilen + ctx->total[0];
    if (ctx->total[0] < ilen) {
      ctx->total[1] = ctx->total[1] + 1;
    }
    fill = ilen;
    ilen_local = (size_t)input;
    if (((uVar1 & 0x7f) != 0) && (__n <= ilen)) {
      memcpy(ctx->buffer + local_2c,input,__n);
      mbedtls_sha512_process(ctx,ctx->buffer);
      ilen_local = (size_t)(input + __n);
      fill = ilen - __n;
      local_2c = 0;
    }
    for (; 0x7f < fill; fill = fill - 0x80) {
      mbedtls_sha512_process(ctx,(uchar *)ilen_local);
      ilen_local = ilen_local + 0x80;
    }
    if (fill != 0) {
      memcpy(ctx->buffer + local_2c,(void *)ilen_local,fill);
    }
  }
  return;
}

Assistant:

void mbedtls_sha512_update( mbedtls_sha512_context *ctx, const unsigned char *input,
                    size_t ilen )
{
    size_t fill;
    unsigned int left;

    if( ilen == 0 )
        return;

    left = (unsigned int) (ctx->total[0] & 0x7F);
    fill = 128 - left;

    ctx->total[0] += (uint64_t) ilen;

    if( ctx->total[0] < (uint64_t) ilen )
        ctx->total[1]++;

    if( left && ilen >= fill )
    {
        memcpy( (void *) (ctx->buffer + left), input, fill );
        mbedtls_sha512_process( ctx, ctx->buffer );
        input += fill;
        ilen  -= fill;
        left = 0;
    }

    while( ilen >= 128 )
    {
        mbedtls_sha512_process( ctx, input );
        input += 128;
        ilen  -= 128;
    }

    if( ilen > 0 )
        memcpy( (void *) (ctx->buffer + left), input, ilen );
}